

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

int SharpYuvConvertWithOptions
              (void *r_ptr,void *g_ptr,void *b_ptr,int rgb_step,int rgb_stride,int rgb_bit_depth,
              void *y_ptr,int y_stride,void *u_ptr,int u_stride,void *v_ptr,int v_stride,
              int yuv_bit_depth,int width,int height,SharpYuvOptions *options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int shift;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  uint8_t *in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  long in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  int in_stack_00000048;
  uint8_t *in_stack_00000050;
  int in_stack_00000058;
  uint8_t *in_stack_00000060;
  int i;
  int sfix;
  int yuv_max;
  int rgb_round;
  int rgb_max;
  SharpYuvConversionMatrix scaled_matrix;
  SharpYuvTransferFunctionType transfer_type;
  SharpYuvConversionMatrix *yuv_matrix;
  int local_b0;
  int local_9c [4];
  int aiStack_8c [4];
  int aiStack_7c [4];
  undefined4 local_6c;
  void *local_68;
  int local_5c;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  int local_34;
  
  local_68 = *(void **)in_stack_00000050;
  local_6c = *(undefined4 *)(in_stack_00000050 + 8);
  iVar1 = (1 << ((byte)in_R9D & 0x1f)) + -1;
  iVar2 = 1 << ((byte)in_R9D - 1 & 0x1f);
  iVar3 = (1 << ((byte)in_stack_00000038 & 0x1f)) + -1;
  local_5c = in_R9D;
  local_58 = in_R8D;
  local_54 = in_ECX;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  shift = GetPrecisionShift(in_R9D);
  if ((((((in_stack_00000040 < 1) || (in_stack_00000048 < 1)) || (in_stack_00000040 == 0x7fffffff))
       || (((in_stack_00000048 == 0x7fffffff || (local_40 == 0)) ||
           ((local_48 == 0 ||
            ((local_50 == 0 || (CONCAT44(in_stack_0000000c,in_stack_00000008) == 0)))))))) ||
      (in_stack_00000018 == (uint8_t *)0x0)) || (in_stack_00000028 == 0)) {
    local_34 = 0;
  }
  else if ((((local_5c == 8) || (local_5c == 10)) || (local_5c == 0xc)) || (local_5c == 0x10)) {
    if (((in_stack_00000038 == 8) || (in_stack_00000038 == 10)) || (in_stack_00000038 == 0xc)) {
      if ((local_5c < 9) || ((local_54 % 2 == 0 && (local_58 % 2 == 0)))) {
        if ((in_stack_00000038 < 9) ||
           (((in_stack_00000010 % 2 == 0 && (in_stack_00000020 % 2 == 0)) &&
            (in_stack_00000030 % 2 == 0)))) {
          SharpYuvInit((VP8CPUInfo)0x20b718);
          if (local_5c == in_stack_00000038) {
            memcpy(local_9c,local_68,0x30);
          }
          else {
            for (local_b0 = 0; local_b0 < 3; local_b0 = local_b0 + 1) {
              local_9c[local_b0] =
                   (*(int *)((long)local_68 + (long)local_b0 * 4) * iVar3 + iVar2) / iVar1;
              aiStack_8c[local_b0] =
                   (*(int *)((long)local_68 + (long)local_b0 * 4 + 0x10) * iVar3 + iVar2) / iVar1;
              aiStack_7c[local_b0] =
                   (*(int *)((long)local_68 + (long)local_b0 * 4 + 0x20) * iVar3 + iVar2) / iVar1;
            }
          }
          local_9c[3] = Shift(*(int *)((long)local_68 + 0xc),shift);
          aiStack_8c[3] = Shift(*(int *)((long)local_68 + 0x1c),shift);
          aiStack_7c[3] = Shift(*(int *)((long)local_68 + 0x2c),shift);
          local_34 = DoSharpArgbToYuv((uint8_t *)CONCAT44(in_stack_00000024,in_stack_00000020),
                                      in_stack_00000018,
                                      (uint8_t *)CONCAT44(in_stack_00000014,in_stack_00000010),
                                      in_stack_0000000c,in_stack_00000008,unaff_retaddr,
                                      in_stack_00000050,in_stack_00000058,in_stack_00000060,i,
                                      _yuv_max,rgb_max,scaled_matrix.rgb_to_y[1],
                                      scaled_matrix.rgb_to_y[3],scaled_matrix.rgb_to_u[1],
                                      (SharpYuvConversionMatrix *)scaled_matrix._28_8_,
                                      scaled_matrix.rgb_to_v[1]);
        }
        else {
          local_34 = 0;
        }
      }
      else {
        local_34 = 0;
      }
    }
    else {
      local_34 = 0;
    }
  }
  else {
    local_34 = 0;
  }
  return local_34;
}

Assistant:

int SharpYuvConvertWithOptions(const void* r_ptr, const void* g_ptr,
                               const void* b_ptr, int rgb_step, int rgb_stride,
                               int rgb_bit_depth, void* y_ptr, int y_stride,
                               void* u_ptr, int u_stride, void* v_ptr,
                               int v_stride, int yuv_bit_depth, int width,
                               int height, const SharpYuvOptions* options) {
  const SharpYuvConversionMatrix* yuv_matrix = options->yuv_matrix;
  SharpYuvTransferFunctionType transfer_type = options->transfer_type;
  SharpYuvConversionMatrix scaled_matrix;
  const int rgb_max = (1 << rgb_bit_depth) - 1;
  const int rgb_round = 1 << (rgb_bit_depth - 1);
  const int yuv_max = (1 << yuv_bit_depth) - 1;
  const int sfix = GetPrecisionShift(rgb_bit_depth);

  if (width < 1 || height < 1 || width == INT_MAX || height == INT_MAX ||
      r_ptr == NULL || g_ptr == NULL || b_ptr == NULL || y_ptr == NULL ||
      u_ptr == NULL || v_ptr == NULL) {
    return 0;
  }
  if (rgb_bit_depth != 8 && rgb_bit_depth != 10 && rgb_bit_depth != 12 &&
      rgb_bit_depth != 16) {
    return 0;
  }
  if (yuv_bit_depth != 8 && yuv_bit_depth != 10 && yuv_bit_depth != 12) {
    return 0;
  }
  if (rgb_bit_depth > 8 && (rgb_step % 2 != 0 || rgb_stride % 2 != 0)) {
    // Step/stride should be even for uint16_t buffers.
    return 0;
  }
  if (yuv_bit_depth > 8 &&
      (y_stride % 2 != 0 || u_stride % 2 != 0 || v_stride % 2 != 0)) {
    // Stride should be even for uint16_t buffers.
    return 0;
  }
  // The address of the function pointer is used to avoid a read race.
  SharpYuvInit((VP8CPUInfo)&SharpYuvGetCPUInfo);

  // Add scaling factor to go from rgb_bit_depth to yuv_bit_depth, to the
  // rgb->yuv conversion matrix.
  if (rgb_bit_depth == yuv_bit_depth) {
    memcpy(&scaled_matrix, yuv_matrix, sizeof(scaled_matrix));
  } else {
    int i;
    for (i = 0; i < 3; ++i) {
      scaled_matrix.rgb_to_y[i] =
          (yuv_matrix->rgb_to_y[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_u[i] =
          (yuv_matrix->rgb_to_u[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_v[i] =
          (yuv_matrix->rgb_to_v[i] * yuv_max + rgb_round) / rgb_max;
    }
  }
  // Also incorporate precision change scaling.
  scaled_matrix.rgb_to_y[3] = Shift(yuv_matrix->rgb_to_y[3], sfix);
  scaled_matrix.rgb_to_u[3] = Shift(yuv_matrix->rgb_to_u[3], sfix);
  scaled_matrix.rgb_to_v[3] = Shift(yuv_matrix->rgb_to_v[3], sfix);

  return DoSharpArgbToYuv(
      (const uint8_t*)r_ptr, (const uint8_t*)g_ptr, (const uint8_t*)b_ptr,
      rgb_step, rgb_stride, rgb_bit_depth, (uint8_t*)y_ptr, y_stride,
      (uint8_t*)u_ptr, u_stride, (uint8_t*)v_ptr, v_stride, yuv_bit_depth,
      width, height, &scaled_matrix, transfer_type);
}